

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_avgdev.c
# Opt level: O3

ErrorNumber test_func_avgdev(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  TA_Test_conflict3 *pTVar4;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict3 *local_40;
  TA_Real *local_38;
  
  pTVar4 = tableTest;
  uVar3 = 0;
  while( true ) {
    if ((int)history->nbBars < pTVar4->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_avgdev.c"
             ,uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    TVar1 = TA_AVGDEV(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInTimePeriod,
                      &outBegIdx,&outNbElement,gBuffer[0].out0);
    EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115ab8;
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar4->expectedRetCode,outBegIdx,
                               pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    outNbElement = 0;
    outBegIdx = 0;
    TVar1 = TA_AVGDEV(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInTimePeriod,
                      &outBegIdx,&outNbElement,gBuffer[1].in);
    EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_00115ab8;
    EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar4->expectedRetCode,outBegIdx,
                               pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    local_38 = history->close;
    local_40 = pTVar4;
    if ((pTVar4->doRangeTestFlag != 0) &&
       (EVar2 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_NONE,&local_40,1,0),
       EVar2 != TA_TEST_PASS)) goto LAB_00115ab8;
    uVar3 = uVar3 + 1;
    pTVar4 = pTVar4 + 1;
    if (uVar3 == 3) {
      return TA_TEST_PASS;
    }
  }
  printf("Fail for output id=%d\n",0);
LAB_00115ab8:
  printf("%s Failed Test #%d (Code=%d)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_avgdev.c"
         ,uVar3 & 0xffffffff,(ulong)EVar2);
  return EVar2;
}

Assistant:

ErrorNumber test_func_avgdev( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}